

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O3

void __thiscall leveldb::FilterBlockBuilder::GenerateFilter(FilterBlockBuilder *this)

{
  uint uVar1;
  iterator __position;
  pointer puVar2;
  pointer pSVar3;
  long lVar4;
  long lVar5;
  iterator iVar6;
  long lVar7;
  long lVar8;
  ulong __new_size;
  unsigned_long local_20;
  
  __position._M_current =
       (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar8 = (long)__position._M_current -
          (long)(this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar8 == 0) {
    uVar1 = (uint)(this->result_)._M_string_length;
    local_20 = CONCAT44(local_20._4_4_,uVar1);
    iVar6._M_current =
         (this->filter_offsets_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (this->filter_offsets_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&this->filter_offsets_,iVar6,(uint *)&local_20);
    }
    else {
      *iVar6._M_current = uVar1;
      (this->filter_offsets_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
  }
  else {
    __new_size = lVar8 >> 3;
    local_20 = (this->keys_)._M_string_length;
    if (__position._M_current ==
        (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&this->start_,__position,&local_20);
    }
    else {
      *__position._M_current = local_20;
      (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::resize
              (&this->tmp_keys_,__new_size);
    lVar8 = __new_size + (__new_size == 0);
    lVar7 = 0;
    do {
      puVar2 = (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pSVar3 = (this->tmp_keys_).super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = *(long *)(lVar7 + (long)puVar2);
      lVar5 = *(long *)(lVar7 + 8 + (long)puVar2);
      *(pointer *)((long)&pSVar3->data_ + lVar7 * 2) = (this->keys_)._M_dataplus._M_p + lVar4;
      *(long *)((long)&pSVar3->size_ + lVar7 * 2) = lVar5 - lVar4;
      lVar7 = lVar7 + 8;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
    uVar1 = (uint)(this->result_)._M_string_length;
    local_20 = CONCAT44(local_20._4_4_,uVar1);
    iVar6._M_current =
         (this->filter_offsets_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (this->filter_offsets_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&this->filter_offsets_,iVar6,(uint *)&local_20);
    }
    else {
      *iVar6._M_current = uVar1;
      (this->filter_offsets_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    (*this->policy_->_vptr_FilterPolicy[3])
              (this->policy_,
               (this->tmp_keys_).super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>
               ._M_impl.super__Vector_impl_data._M_start,__new_size & 0xffffffff,&this->result_);
    pSVar3 = (this->tmp_keys_).super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->tmp_keys_).super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>.
        _M_impl.super__Vector_impl_data._M_finish != pSVar3) {
      (this->tmp_keys_).super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
      super__Vector_impl_data._M_finish = pSVar3;
    }
    (this->keys_)._M_string_length = 0;
    *(this->keys_)._M_dataplus._M_p = '\0';
    puVar2 = (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar2) {
      (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
  }
  return;
}

Assistant:

void FilterBlockBuilder::GenerateFilter() {
  const size_t num_keys = start_.size();
  if (num_keys == 0) {
    // Fast path if there are no keys for this filter
    filter_offsets_.push_back((uint32_t)result_.size());
    return;
  }

  // Make list of keys from flattened key structure
  start_.push_back(keys_.size());  // Simplify length computation
  tmp_keys_.resize(num_keys);
  for (size_t i = 0; i < num_keys; i++) {
    const char* base = keys_.data() + start_[i];
    size_t length = start_[i + 1] - start_[i];
    tmp_keys_[i] = Slice(base, length);
  }

  // Generate filter for current set of keys and append to result_.
  filter_offsets_.push_back((uint32_t)result_.size());
  policy_->CreateFilter(&tmp_keys_[0], static_cast<int>(num_keys), &result_);

  tmp_keys_.clear();
  keys_.clear();
  start_.clear();
}